

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::JapaneseCalendar::getDefaultMonthInYear(JapaneseCalendar *this,int32_t eyear)

{
  UErrorCode local_34;
  int local_30;
  UErrorCode status;
  int32_t eraStart [3];
  int32_t month;
  int32_t era;
  int32_t eyear_local;
  JapaneseCalendar *this_local;
  
  eraStart[2] = (*(this->super_GregorianCalendar).super_Calendar.super_UObject._vptr_UObject[0x32])
                          ();
  eraStart[1] = 0;
  memset(&local_30,0,0xc);
  local_34 = U_ZERO_ERROR;
  EraRules::getStartDate(gJapaneseEraRules,eraStart[2],(int32_t (*) [3])&local_30,&local_34);
  if (eyear == local_30) {
    this_local._4_4_ = status + ~U_ZERO_ERROR;
  }
  else {
    this_local._4_4_ = eraStart[1];
  }
  return this_local._4_4_;
}

Assistant:

int32_t JapaneseCalendar::getDefaultMonthInYear(int32_t eyear) 
{
    int32_t era = internalGetEra();
    // TODO do we assume we can trust 'era'?  What if it is denormalized?

    int32_t month = 0;

    // Find out if we are at the edge of an era
    int32_t eraStart[3] = { 0,0,0 };
    UErrorCode status = U_ZERO_ERROR;
    gJapaneseEraRules->getStartDate(era, eraStart, status);
    U_ASSERT(U_SUCCESS(status));
    if(eyear == eraStart[0]) {
        // Yes, we're in the first year of this era.
        return eraStart[1]  // month
                -1;         // return 0-based month
    }

    return month;
}